

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Shape.cpp
# Opt level: O0

void __thiscall Assimp::X3DImporter::ParseNode_Shape_Shape(X3DImporter *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  pointer pFVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar6;
  CX3DImporter_NodeElement *this_00;
  allocator<char> local_4f9;
  string local_4f8;
  allocator<char> local_4d1;
  string local_4d0;
  allocator<char> local_4a9;
  string local_4a8;
  allocator<char> local_481;
  string local_480;
  allocator<char> local_459;
  string local_458;
  allocator<char> local_431;
  string local_430;
  allocator<char> local_409;
  string local_408;
  allocator<char> local_3e1;
  string local_3e0;
  allocator<char> local_3b9;
  string local_3b8;
  allocator<char> local_391;
  string local_390;
  allocator<char> local_369;
  string local_368;
  allocator<char> local_341;
  string local_340;
  allocator<char> local_319;
  string local_318;
  allocator<char> local_2f1;
  string local_2f0;
  allocator<char> local_2c9;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  allocator<char> local_229;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  allocator<char> local_189;
  string local_188;
  allocator<char> local_161;
  string local_160;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  byte local_99;
  undefined4 local_98;
  bool close_found;
  undefined1 local_90 [8];
  string an;
  uint local_5c;
  int idx_end;
  int idx;
  CX3DImporter_NodeElement *ne;
  string def;
  string use;
  X3DImporter *this_local;
  
  std::__cxx11::string::string((string *)(def.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&ne);
  _idx_end = (CX3DImporter_NodeElement *)0x0;
  local_5c = 0;
  pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                     (&this->mReader);
  iVar2 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  for (; (int)local_5c < iVar2; local_5c = local_5c + 1) {
    pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar5,(ulong)local_5c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_90,(char *)CONCAT44(extraout_var,iVar3),
               (allocator<char> *)&close_found);
    std::allocator<char>::~allocator((allocator<char> *)&close_found);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_90,"DEF");
    if (bVar1) {
      pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                         (&this->mReader);
      iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                        (pFVar5,(ulong)local_5c);
      std::__cxx11::string::operator=((string *)&ne,(char *)CONCAT44(extraout_var_00,iVar3));
      local_98 = 4;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_90,"USE");
      if (bVar1) {
        pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                 operator->(&this->mReader);
        iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                          (pFVar5,(ulong)local_5c);
        std::__cxx11::string::operator=
                  ((string *)(def.field_2._M_local_buf + 8),(char *)CONCAT44(extraout_var_01,iVar3))
        ;
        local_98 = 4;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_90,"bboxCenter");
        if (bVar1) {
          local_98 = 4;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_90,"bboxSize");
          if (bVar1) {
            local_98 = 4;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_90,"containerField");
            if (bVar1) {
              local_98 = 4;
            }
            else {
              Throw_IncorrectAttr(this,(string *)local_90);
              local_98 = 0;
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_90);
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    XML_CheckNode_MustBeEmpty(this);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      Throw_DEF_And_USE(this);
    }
    bVar1 = FindNodeElement(this,(string *)((long)&def.field_2 + 8),ENET_Shape,
                            (CX3DImporter_NodeElement **)&idx_end);
    if (!bVar1) {
      Throw_USE_NotFound(this,(string *)((long)&def.field_2 + 8));
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
  }
  else {
    this_00 = (CX3DImporter_NodeElement *)operator_new(0x50);
    CX3DImporter_NodeElement_Shape::CX3DImporter_NodeElement_Shape
              ((CX3DImporter_NodeElement_Shape *)this_00,this->NodeElement_Cur);
    _idx_end = this_00;
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::__cxx11::string::operator=((string *)&_idx_end->ID,(string *)&ne);
    }
    pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    uVar4 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    if ((uVar4 & 1) == 0) {
      ParseHelper_Node_Enter(this,_idx_end);
      local_99 = 0;
      do {
        do {
          while( true ) {
            pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                     operator->(&this->mReader);
            uVar4 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[2])
                              ();
            if ((uVar4 & 1) == 0) goto LAB_00aaacf0;
            pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                     operator->(&this->mReader);
            iVar2 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])
                              ();
            if (iVar2 != 1) break;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_c0,"Appearance",&local_c1);
            bVar1 = XML_CheckNode_NameEqual(this,&local_c0);
            std::__cxx11::string::~string((string *)&local_c0);
            std::allocator<char>::~allocator(&local_c1);
            if (bVar1) {
              ParseNode_Shape_Appearance(this);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_e8,"Arc2D",&local_e9);
              bVar1 = XML_CheckNode_NameEqual(this,&local_e8);
              std::__cxx11::string::~string((string *)&local_e8);
              std::allocator<char>::~allocator(&local_e9);
              if (bVar1) {
                ParseNode_Geometry2D_Arc2D(this);
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_110,"ArcClose2D",&local_111);
                bVar1 = XML_CheckNode_NameEqual(this,&local_110);
                std::__cxx11::string::~string((string *)&local_110);
                std::allocator<char>::~allocator(&local_111);
                if (bVar1) {
                  ParseNode_Geometry2D_ArcClose2D(this);
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_138,"Circle2D",&local_139);
                  bVar1 = XML_CheckNode_NameEqual(this,&local_138);
                  std::__cxx11::string::~string((string *)&local_138);
                  std::allocator<char>::~allocator(&local_139);
                  if (bVar1) {
                    ParseNode_Geometry2D_Circle2D(this);
                  }
                  else {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_160,"Disk2D",&local_161);
                    bVar1 = XML_CheckNode_NameEqual(this,&local_160);
                    std::__cxx11::string::~string((string *)&local_160);
                    std::allocator<char>::~allocator(&local_161);
                    if (bVar1) {
                      ParseNode_Geometry2D_Disk2D(this);
                    }
                    else {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_188,"Polyline2D",&local_189);
                      bVar1 = XML_CheckNode_NameEqual(this,&local_188);
                      std::__cxx11::string::~string((string *)&local_188);
                      std::allocator<char>::~allocator(&local_189);
                      if (bVar1) {
                        ParseNode_Geometry2D_Polyline2D(this);
                      }
                      else {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_1b0,"Polypoint2D",&local_1b1);
                        bVar1 = XML_CheckNode_NameEqual(this,&local_1b0);
                        std::__cxx11::string::~string((string *)&local_1b0);
                        std::allocator<char>::~allocator(&local_1b1);
                        if (bVar1) {
                          ParseNode_Geometry2D_Polypoint2D(this);
                        }
                        else {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_1d8,"Rectangle2D",&local_1d9);
                          bVar1 = XML_CheckNode_NameEqual(this,&local_1d8);
                          std::__cxx11::string::~string((string *)&local_1d8);
                          std::allocator<char>::~allocator(&local_1d9);
                          if (bVar1) {
                            ParseNode_Geometry2D_Rectangle2D(this);
                          }
                          else {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_200,"TriangleSet2D",&local_201);
                            bVar1 = XML_CheckNode_NameEqual(this,&local_200);
                            std::__cxx11::string::~string((string *)&local_200);
                            std::allocator<char>::~allocator(&local_201);
                            if (bVar1) {
                              ParseNode_Geometry2D_TriangleSet2D(this);
                            }
                            else {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_228,"Box",&local_229);
                              bVar1 = XML_CheckNode_NameEqual(this,&local_228);
                              std::__cxx11::string::~string((string *)&local_228);
                              std::allocator<char>::~allocator(&local_229);
                              if (bVar1) {
                                ParseNode_Geometry3D_Box(this);
                              }
                              else {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_250,"Cone",&local_251);
                                bVar1 = XML_CheckNode_NameEqual(this,&local_250);
                                std::__cxx11::string::~string((string *)&local_250);
                                std::allocator<char>::~allocator(&local_251);
                                if (bVar1) {
                                  ParseNode_Geometry3D_Cone(this);
                                }
                                else {
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&local_278,"Cylinder",&local_279);
                                  bVar1 = XML_CheckNode_NameEqual(this,&local_278);
                                  std::__cxx11::string::~string((string *)&local_278);
                                  std::allocator<char>::~allocator(&local_279);
                                  if (bVar1) {
                                    ParseNode_Geometry3D_Cylinder(this);
                                  }
                                  else {
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&local_2a0,"ElevationGrid",&local_2a1);
                                    bVar1 = XML_CheckNode_NameEqual(this,&local_2a0);
                                    std::__cxx11::string::~string((string *)&local_2a0);
                                    std::allocator<char>::~allocator(&local_2a1);
                                    if (bVar1) {
                                      ParseNode_Geometry3D_ElevationGrid(this);
                                    }
                                    else {
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)&local_2c8,"Extrusion",&local_2c9);
                                      bVar1 = XML_CheckNode_NameEqual(this,&local_2c8);
                                      std::__cxx11::string::~string((string *)&local_2c8);
                                      std::allocator<char>::~allocator(&local_2c9);
                                      if (bVar1) {
                                        ParseNode_Geometry3D_Extrusion(this);
                                      }
                                      else {
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_2f0,"IndexedFaceSet",&local_2f1)
                                        ;
                                        bVar1 = XML_CheckNode_NameEqual(this,&local_2f0);
                                        std::__cxx11::string::~string((string *)&local_2f0);
                                        std::allocator<char>::~allocator(&local_2f1);
                                        if (bVar1) {
                                          ParseNode_Geometry3D_IndexedFaceSet(this);
                                        }
                                        else {
                                          std::allocator<char>::allocator();
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&local_318,"Sphere",&local_319);
                                          bVar1 = XML_CheckNode_NameEqual(this,&local_318);
                                          std::__cxx11::string::~string((string *)&local_318);
                                          std::allocator<char>::~allocator(&local_319);
                                          if (bVar1) {
                                            ParseNode_Geometry3D_Sphere(this);
                                          }
                                          else {
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      ((string *)&local_340,"IndexedLineSet",
                                                       &local_341);
                                            bVar1 = XML_CheckNode_NameEqual(this,&local_340);
                                            std::__cxx11::string::~string((string *)&local_340);
                                            std::allocator<char>::~allocator(&local_341);
                                            if (bVar1) {
                                              ParseNode_Rendering_IndexedLineSet(this);
                                            }
                                            else {
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&local_368,"LineSet",&local_369);
                                              bVar1 = XML_CheckNode_NameEqual(this,&local_368);
                                              std::__cxx11::string::~string((string *)&local_368);
                                              std::allocator<char>::~allocator(&local_369);
                                              if (bVar1) {
                                                ParseNode_Rendering_LineSet(this);
                                              }
                                              else {
                                                std::allocator<char>::allocator();
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)&local_390,"PointSet",
                                                           &local_391);
                                                bVar1 = XML_CheckNode_NameEqual(this,&local_390);
                                                std::__cxx11::string::~string((string *)&local_390);
                                                std::allocator<char>::~allocator(&local_391);
                                                if (bVar1) {
                                                  ParseNode_Rendering_PointSet(this);
                                                }
                                                else {
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_3b8,
                                                             "IndexedTriangleFanSet",&local_3b9);
                                                  bVar1 = XML_CheckNode_NameEqual(this,&local_3b8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_3b8);
                                                  std::allocator<char>::~allocator(&local_3b9);
                                                  if (bVar1) {
                                                    ParseNode_Rendering_IndexedTriangleFanSet(this);
                                                  }
                                                  else {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_3e0,
                                                               "IndexedTriangleSet",&local_3e1);
                                                    bVar1 = XML_CheckNode_NameEqual(this,&local_3e0)
                                                    ;
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_3e0);
                                                    std::allocator<char>::~allocator(&local_3e1);
                                                    if (bVar1) {
                                                      ParseNode_Rendering_IndexedTriangleSet(this);
                                                    }
                                                    else {
                                                      std::allocator<char>::allocator();
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_408,
                                                                 "IndexedTriangleStripSet",
                                                                 &local_409);
                                                      bVar1 = XML_CheckNode_NameEqual
                                                                        (this,&local_408);
                                                      std::__cxx11::string::~string
                                                                ((string *)&local_408);
                                                      std::allocator<char>::~allocator(&local_409);
                                                      if (bVar1) {
                                                        ParseNode_Rendering_IndexedTriangleStripSet
                                                                  (this);
                                                      }
                                                      else {
                                                        std::allocator<char>::allocator();
                                                        std::__cxx11::string::
                                                        string<std::allocator<char>>
                                                                  ((string *)&local_430,
                                                                   "TriangleFanSet",&local_431);
                                                        bVar1 = XML_CheckNode_NameEqual
                                                                          (this,&local_430);
                                                        std::__cxx11::string::~string
                                                                  ((string *)&local_430);
                                                        std::allocator<char>::~allocator(&local_431)
                                                        ;
                                                        if (bVar1) {
                                                          ParseNode_Rendering_TriangleFanSet(this);
                                                        }
                                                        else {
                                                          std::allocator<char>::allocator();
                                                          std::__cxx11::string::
                                                          string<std::allocator<char>>
                                                                    ((string *)&local_458,
                                                                     "TriangleSet",&local_459);
                                                          bVar1 = XML_CheckNode_NameEqual
                                                                            (this,&local_458);
                                                          std::__cxx11::string::~string
                                                                    ((string *)&local_458);
                                                          std::allocator<char>::~allocator
                                                                    (&local_459);
                                                          if (bVar1) {
                                                            ParseNode_Rendering_TriangleSet(this);
                                                          }
                                                          else {
                                                            std::allocator<char>::allocator();
                                                            std::__cxx11::string::
                                                            string<std::allocator<char>>
                                                                      ((string *)&local_480,
                                                                       "TriangleStripSet",&local_481
                                                                      );
                                                            bVar1 = XML_CheckNode_NameEqual
                                                                              (this,&local_480);
                                                            std::__cxx11::string::~string
                                                                      ((string *)&local_480);
                                                            std::allocator<char>::~allocator
                                                                      (&local_481);
                                                            if (bVar1) {
                                                              ParseNode_Rendering_TriangleStripSet
                                                                        (this);
                                                            }
                                                            else {
                                                              bVar1 = 
                                                  ParseHelper_CheckRead_X3DMetadataObject(this);
                                                  if (!bVar1) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_4a8,"Shape",
                                                               &local_4a9);
                                                    XML_CheckNode_SkipUnsupported(this,&local_4a8);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_4a8);
                                                    std::allocator<char>::~allocator(&local_4a9);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                   operator->(&this->mReader);
          iVar2 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])()
          ;
        } while (iVar2 != 2);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,"Shape",&local_4d1);
        bVar1 = XML_CheckNode_NameEqual(this,&local_4d0);
        std::__cxx11::string::~string((string *)&local_4d0);
        std::allocator<char>::~allocator(&local_4d1);
      } while (!bVar1);
      local_99 = 1;
LAB_00aaacf0:
      if ((local_99 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f8,"Shape",&local_4f9);
        Throw_CloseNotFound(this,&local_4f8);
        std::__cxx11::string::~string((string *)&local_4f8);
        std::allocator<char>::~allocator(&local_4f9);
      }
      ParseHelper_Node_Exit(this);
    }
    else {
      std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
      push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_List,(value_type *)&idx_end);
  }
  std::__cxx11::string::~string((string *)&ne);
  std::__cxx11::string::~string((string *)(def.field_2._M_local_buf + 8));
  return;
}

Assistant:

void X3DImporter::ParseNode_Shape_Shape()
{
    std::string use, def;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_Shape, ne);
	}
	else
	{
		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Shape(NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

        // check for child nodes
        if(!mReader->isEmptyElement())
        {
			ParseHelper_Node_Enter(ne);
			MACRO_NODECHECK_LOOPBEGIN("Shape");
				// check for appearance node
				if(XML_CheckNode_NameEqual("Appearance")) { ParseNode_Shape_Appearance(); continue; }
				// check for X3DGeometryNodes
				if(XML_CheckNode_NameEqual("Arc2D")) { ParseNode_Geometry2D_Arc2D(); continue; }
				if(XML_CheckNode_NameEqual("ArcClose2D")) { ParseNode_Geometry2D_ArcClose2D(); continue; }
				if(XML_CheckNode_NameEqual("Circle2D")) { ParseNode_Geometry2D_Circle2D(); continue; }
				if(XML_CheckNode_NameEqual("Disk2D")) { ParseNode_Geometry2D_Disk2D(); continue; }
				if(XML_CheckNode_NameEqual("Polyline2D")) { ParseNode_Geometry2D_Polyline2D(); continue; }
				if(XML_CheckNode_NameEqual("Polypoint2D")) { ParseNode_Geometry2D_Polypoint2D(); continue; }
				if(XML_CheckNode_NameEqual("Rectangle2D")) { ParseNode_Geometry2D_Rectangle2D(); continue; }
				if(XML_CheckNode_NameEqual("TriangleSet2D")) { ParseNode_Geometry2D_TriangleSet2D(); continue; }
				if(XML_CheckNode_NameEqual("Box")) { ParseNode_Geometry3D_Box(); continue; }
				if(XML_CheckNode_NameEqual("Cone")) { ParseNode_Geometry3D_Cone(); continue; }
				if(XML_CheckNode_NameEqual("Cylinder")) { ParseNode_Geometry3D_Cylinder(); continue; }
				if(XML_CheckNode_NameEqual("ElevationGrid")) { ParseNode_Geometry3D_ElevationGrid(); continue; }
				if(XML_CheckNode_NameEqual("Extrusion")) { ParseNode_Geometry3D_Extrusion(); continue; }
				if(XML_CheckNode_NameEqual("IndexedFaceSet")) { ParseNode_Geometry3D_IndexedFaceSet(); continue; }
				if(XML_CheckNode_NameEqual("Sphere")) { ParseNode_Geometry3D_Sphere(); continue; }
				if(XML_CheckNode_NameEqual("IndexedLineSet")) { ParseNode_Rendering_IndexedLineSet(); continue; }
				if(XML_CheckNode_NameEqual("LineSet")) { ParseNode_Rendering_LineSet(); continue; }
				if(XML_CheckNode_NameEqual("PointSet")) { ParseNode_Rendering_PointSet(); continue; }
				if(XML_CheckNode_NameEqual("IndexedTriangleFanSet")) { ParseNode_Rendering_IndexedTriangleFanSet(); continue; }
				if(XML_CheckNode_NameEqual("IndexedTriangleSet")) { ParseNode_Rendering_IndexedTriangleSet(); continue; }
				if(XML_CheckNode_NameEqual("IndexedTriangleStripSet")) { ParseNode_Rendering_IndexedTriangleStripSet(); continue; }
				if(XML_CheckNode_NameEqual("TriangleFanSet")) { ParseNode_Rendering_TriangleFanSet(); continue; }
				if(XML_CheckNode_NameEqual("TriangleSet")) { ParseNode_Rendering_TriangleSet(); continue; }
				if(XML_CheckNode_NameEqual("TriangleStripSet")) { ParseNode_Rendering_TriangleStripSet(); continue; }
				// check for X3DMetadataObject
				if(!ParseHelper_CheckRead_X3DMetadataObject()) XML_CheckNode_SkipUnsupported("Shape");

			MACRO_NODECHECK_LOOPEND("Shape");
			ParseHelper_Node_Exit();
		}// if(!mReader->isEmptyElement())
		else
		{
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element
		}

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}